

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void iadst16_stage8_avx2(__m256i *x1,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  undefined4 uVar1;
  undefined4 uVar2;
  int32_t cos_bit_00;
  int32_t cos_bit_01;
  int32_t cos_bit_02;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined1 in_stack_00000028 [32];
  undefined1 in_stack_00000048 [32];
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  uVar2 = 0xb500b50;
  uVar1 = 0xf4b00b50;
  w0[1]._0_4_ = 0xf4b00b50;
  w0[0] = 0xf4b00b50f4b00b50;
  w0[1]._4_4_ = 0xf4b00b50;
  w0[2]._0_4_ = 0xf4b00b50;
  w0[2]._4_4_ = 0xf4b00b50;
  w0[3]._0_4_ = 0xf4b00b50;
  w0[3]._4_4_ = 0xf4b00b50;
  w1[1]._0_4_ = 0xb500b50;
  w1[0] = 0xb500b500b500b50;
  w1[1]._4_4_ = 0xb500b50;
  w1[2]._0_4_ = 0xb500b50;
  w1[2]._4_4_ = 0xb500b50;
  w1[3]._0_4_ = 0xb500b50;
  w1[3]._4_4_ = 0xb500b50;
  _r_00[1] = in_XMM0_Qb;
  _r_00[0] = in_XMM0_Qa;
  _r_00[2] = in_YMM0_H;
  _r_00[3] = in_register_00001218;
  uVar3 = uVar1;
  uVar4 = uVar1;
  uVar5 = uVar1;
  uVar6 = uVar1;
  uVar7 = uVar1;
  uVar8 = uVar1;
  uVar9 = uVar1;
  uVar10 = uVar2;
  uVar11 = uVar2;
  uVar12 = uVar2;
  uVar13 = uVar2;
  uVar14 = uVar2;
  uVar15 = uVar2;
  uVar16 = uVar2;
  btf_16_w16_avx2(w0,w1,x1 + 2,x1 + 3,_r_00,0xb500b50);
  w0_00[0]._4_4_ = uVar3;
  w0_00[0]._0_4_ = uVar1;
  w0_00[1]._0_4_ = uVar4;
  w0_00[1]._4_4_ = uVar5;
  w0_00[2]._0_4_ = uVar6;
  w0_00[2]._4_4_ = uVar7;
  w0_00[3]._0_4_ = uVar8;
  w0_00[3]._4_4_ = uVar9;
  w1_00[0]._4_4_ = uVar10;
  w1_00[0]._0_4_ = uVar2;
  w1_00[1]._0_4_ = uVar11;
  w1_00[1]._4_4_ = uVar12;
  w1_00[2]._0_4_ = uVar13;
  w1_00[2]._4_4_ = uVar14;
  w1_00[3]._0_4_ = uVar15;
  w1_00[3]._4_4_ = uVar16;
  _r_01[1] = in_XMM0_Qb;
  _r_01[0] = in_XMM0_Qa;
  _r_01[2] = in_YMM0_H;
  _r_01[3] = in_register_00001218;
  btf_16_w16_avx2(w0_00,w1_00,x1 + 6,x1 + 7,_r_01,cos_bit_00);
  w0_01[0]._4_4_ = uVar3;
  w0_01[0]._0_4_ = uVar1;
  w0_01[1]._0_4_ = uVar4;
  w0_01[1]._4_4_ = uVar5;
  w0_01[2]._0_4_ = uVar6;
  w0_01[2]._4_4_ = uVar7;
  w0_01[3]._0_4_ = uVar8;
  w0_01[3]._4_4_ = uVar9;
  w1_01[0]._4_4_ = uVar10;
  w1_01[0]._0_4_ = uVar2;
  w1_01[1]._0_4_ = uVar11;
  w1_01[1]._4_4_ = uVar12;
  w1_01[2]._0_4_ = uVar13;
  w1_01[2]._4_4_ = uVar14;
  w1_01[3]._0_4_ = uVar15;
  w1_01[3]._4_4_ = uVar16;
  _r_02[1] = in_XMM0_Qb;
  _r_02[0] = in_XMM0_Qa;
  _r_02[2] = in_YMM0_H;
  _r_02[3] = in_register_00001218;
  btf_16_w16_avx2(w0_01,w1_01,x1 + 10,x1 + 0xb,_r_02,cos_bit_01);
  btf_16_w16_avx2(_r,(__m256i)in_stack_00000028,x1 + 0xe,x1 + 0xf,(__m256i)in_stack_00000048,
                  cos_bit_02);
  return;
}

Assistant:

static inline void iadst16_stage8_avx2(__m256i *x1, const int32_t *cospi,
                                       const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[2], &x1[3], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[6], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[10], &x1[11], _r, cos_bit);
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[14], &x1[15], _r, cos_bit);
}